

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_9::DiskHandle::clone
          (DiskHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Fault f;
  
  do {
    iVar1 = fcntl64(*(undefined4 *)__fn,0x406,3);
    if (-1 < iVar1) goto LAB_001de623;
    iVar2 = _::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 == 0) {
LAB_001de623:
    (this->fd).fd = iVar1;
  }
  else {
    if ((iVar2 != 0x16) && (iVar2 != 0x5f)) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x124,iVar2,"fnctl(fd, F_DUPFD_CLOEXEC, 3)","");
      _::Debug::Fault::~Fault(&f);
    }
    do {
      iVar1 = dup(*(int *)__fn);
      if (-1 < iVar1) goto LAB_001de53d;
      iVar2 = _::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      _::Debug::Fault::Fault
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,299,iVar2,"_kj_fd = ::dup(fd)","");
      _::Debug::Fault::fatal(&f);
    }
LAB_001de53d:
    (this->fd).fd = iVar1;
    do {
      iVar2 = ioctl(iVar1,0x5451);
      if (-1 < iVar2) goto LAB_001de626;
      iVar2 = _::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 != 0) {
      if ((iVar2 != 0x16) && (iVar2 != 0x5f)) {
        _::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,100,iVar2,"ioctl(fd, FIOCLEX)","");
        _::Debug::Fault::~Fault(&f);
      }
      do {
        uVar3 = fcntl64(iVar1,1);
        if (-1 < (int)uVar3) goto LAB_001de5c8;
        iVar2 = _::Debug::getOsErrorNumber(false);
      } while (iVar2 == -1);
      if (iVar2 != 0) {
        _::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x72,iVar2,"flags = fcntl(fd, F_GETFD)","");
        _::Debug::Fault::fatal(&f);
      }
LAB_001de5c8:
      if ((uVar3 & 1) == 0) {
        do {
          iVar2 = fcntl64(iVar1,2,uVar3 | 1);
          if (-1 < iVar2) goto LAB_001de626;
          iVar2 = _::Debug::getOsErrorNumber(false);
        } while (iVar2 == -1);
        if (iVar2 != 0) {
          _::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x74,iVar2,"fcntl(fd, F_SETFD, flags | FD_CLOEXEC)","");
          _::Debug::Fault::fatal(&f);
        }
      }
    }
  }
LAB_001de626:
  return (int)this;
}

Assistant:

OwnFd clone() const {
#ifdef F_DUPFD_CLOEXEC
    int fd2;
    KJ_SYSCALL_HANDLE_ERRORS(fd2 = fcntl(fd, F_DUPFD_CLOEXEC, 3)) {
      case EINVAL:
      case EOPNOTSUPP:
        // fall back
        break;
      default:
        KJ_FAIL_SYSCALL("fnctl(fd, F_DUPFD_CLOEXEC, 3)", error) { break; }
        break;
    } else {
      return OwnFd(fd2);
    }
#endif

    auto result = KJ_SYSCALL_FD(::dup(fd));
    setCloexec(result);
    return result;
  }